

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::clearDualBounds
          (SPxSolverBase<double> *this,Status stat,double *upp,double *lw)

{
  undefined8 *puVar1;
  ulong *puVar2;
  ulong *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  
  if (in_ESI == -6) {
LAB_0027fe7d:
    puVar1 = (undefined8 *)infinity();
    *in_RDX = *puVar1;
    puVar2 = (ulong *)infinity();
    *in_RCX = *puVar2 ^ 0x8000000000000000;
  }
  else {
    if (in_ESI == -4) {
LAB_0027fece:
      puVar2 = (ulong *)infinity();
      *in_RCX = *puVar2 ^ 0x8000000000000000;
      return;
    }
    if (in_ESI != -2) {
      if (in_ESI == 1) goto LAB_0027fe7d;
      if (in_ESI == 2) goto LAB_0027fece;
      if (in_ESI != 4) {
        return;
      }
    }
    puVar1 = (undefined8 *)infinity();
    *in_RDX = *puVar1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}